

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall TypeSpacebase::saveXml(TypeSpacebase *this,ostream *s)

{
  ostream *s_00;
  string *val;
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  TypeSpacebase *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<type");
  Datatype::saveXmlBasic(&this->super_Datatype,local_18);
  s_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"space",&local_39);
  val = AddrSpace::getName_abi_cxx11_(this->spaceid);
  a_v(s_00,(string *)local_38,val);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator<<(local_18,'>');
  Address::saveXml(&this->localframe,local_18);
  std::operator<<(local_18,"</type>");
  return;
}

Assistant:

void TypeSpacebase::saveXml(ostream &s) const

{
  s << "<type";
  saveXmlBasic(s);
  a_v(s,"space",spaceid->getName());
  s << '>';
  localframe.saveXml(s);
  s << "</type>";
}